

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

Image * __thiscall
pbrt::Image::Crop(Image *__return_storage_ptr__,Image *this,Bounds2i *bounds,Allocator alloc)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  int iVar4;
  Point2i resolution;
  ulong uVar5;
  int iVar6;
  Point2i p;
  int iVar7;
  Image *this_00;
  uint uVar8;
  Tuple2<pbrt::Point2,_int> TVar9;
  Tuple2<pbrt::Point2,_int> p_00;
  Bounds2i *__range1;
  Float value;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  ulong local_60;
  int vb;
  int va;
  Tuple2<pbrt::Point2,_int> local_48;
  Image *local_40;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_38;
  
  uVar2 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.x;
  uVar8 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.y;
  vb = 0;
  iVar7 = (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.y - uVar8;
  resolution.super_Tuple2<pbrt::Point2,_int>.x =
       (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.x - uVar2;
  va = iVar7 * resolution.super_Tuple2<pbrt::Point2,_int>.x;
  if (va < 1) {
    LogFatal<char_const(&)[14],char_const(&)[2],char_const(&)[14],int&,char_const(&)[2],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
               ,0x511,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [14])"bounds.Area()",
               (char (*) [2])0x2cb1f4a,(char (*) [14])"bounds.Area()",&va,(char (*) [2])0x2cb1f4a,
               &vb);
  }
  if (-1 < (int)(uVar8 | uVar2)) {
    local_38.bits =
         (this->encoding).
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         .bits;
    resolution.super_Tuple2<pbrt::Point2,_int>.y = iVar7;
    channels.n = (this->channelNames).nStored;
    channels.ptr = (this->channelNames).ptr;
    local_40 = this;
    Image(__return_storage_ptr__,this->format,resolution,channels,(ColorEncodingHandle *)&local_38,
          alloc);
    local_48 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>;
    uVar2 = (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.x;
    iVar7 = (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.y;
    local_60 = (ulong)local_48 >> 0x20;
    iVar4 = local_48.y;
    iVar6 = iVar7;
    if (iVar7 <= iVar4) {
      iVar6 = iVar4;
    }
    if (iVar4 < iVar7 && local_48.x < (int)uVar2) {
      sVar3 = (local_40->channelNames).nStored;
      uVar5 = (ulong)local_48 & 0xffffffff;
      TVar9 = (Tuple2<pbrt::Point2,_int>)((ulong)local_48 & 0xffffffff);
      this_00 = local_40;
      p_00 = local_48;
      do {
        if (0 < (int)sVar3) {
          iVar7 = 0;
          do {
            iVar4 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.x;
            iVar1 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.y;
            value = GetChannel(this_00,(Point2i)p_00,iVar7,(WrapMode2D)0x200000002);
            p.super_Tuple2<pbrt::Point2,_int>.x = TVar9.x - iVar4;
            p.super_Tuple2<pbrt::Point2,_int>.y = (int)local_60 - iVar1;
            SetChannel(__return_storage_ptr__,p,iVar7,value);
            iVar7 = iVar7 + 1;
            sVar3 = (local_40->channelNames).nStored;
            this_00 = local_40;
          } while (iVar7 < (int)sVar3);
          uVar5 = (ulong)(uint)(bounds->pMin).super_Tuple2<pbrt::Point2,_int>.x;
          uVar2 = (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.x;
        }
        uVar8 = TVar9.x + 1;
        TVar9 = (Tuple2<pbrt::Point2,_int>)
                ((uVar5 | (ulong)p_00 & 0xffffffff00000000) + 0x100000000);
        if (uVar8 != uVar2) {
          TVar9 = (Tuple2<pbrt::Point2,_int>)(((ulong)p_00 & 0xffffffff00000000) + (ulong)uVar8);
        }
        local_60 = (ulong)TVar9 >> 0x20;
        p_00 = TVar9;
      } while ((local_48.x != TVar9.x) || (iVar6 != TVar9.y));
    }
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[41]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
             ,0x512,"Check failed: %s",(char (*) [41])"bounds.pMin.x >= 0 && bounds.pMin.y >= 0");
}

Assistant:

Image Image::Crop(const Bounds2i &bounds, Allocator alloc) const {
    CHECK_GT(bounds.Area(), 0);
    CHECK(bounds.pMin.x >= 0 && bounds.pMin.y >= 0);
    Image image(format, Point2i(bounds.pMax - bounds.pMin), channelNames, encoding,
                alloc);
    for (Point2i p : bounds)
        for (int c = 0; c < NChannels(); ++c)
            image.SetChannel(Point2i(p - bounds.pMin), c, GetChannel(p, c));
    return image;
}